

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void I400ToARGBRow_C(uint8_t *src_y,uint8_t *rgb_buf,YuvConstants *yuvconstants,int width)

{
  int iVar1;
  long lVar2;
  uint8_t uVar3;
  int iVar4;
  
  if (1 < width) {
    lVar2 = 0;
    do {
      iVar4 = ((int)yuvconstants->kYToRgb[0] * (uint)src_y[lVar2] * 0x101 >> 0x10) +
              (int)yuvconstants->kYBiasToRgb[0];
      if (iVar4 >> 6 < 1) {
        iVar4 = 0;
      }
      iVar4 = iVar4 >> 6;
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      uVar3 = (uint8_t)iVar4;
      *rgb_buf = uVar3;
      rgb_buf[1] = uVar3;
      rgb_buf[2] = uVar3;
      rgb_buf[3] = 0xff;
      iVar4 = ((int)yuvconstants->kYToRgb[0] * (uint)src_y[lVar2 + 1] * 0x101 >> 0x10) +
              (int)yuvconstants->kYBiasToRgb[0];
      if (iVar4 >> 6 < 1) {
        iVar4 = 0;
      }
      iVar4 = iVar4 >> 6;
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      uVar3 = (uint8_t)iVar4;
      rgb_buf[4] = uVar3;
      rgb_buf[5] = uVar3;
      rgb_buf[6] = uVar3;
      rgb_buf[7] = 0xff;
      rgb_buf = rgb_buf + 8;
      lVar2 = lVar2 + 2;
    } while ((int)lVar2 < width + -1);
    src_y = src_y + lVar2;
  }
  if ((width & 1U) != 0) {
    iVar1 = (int)(((int)yuvconstants->kYToRgb[0] * (uint)*src_y * 0x101 >> 0x10) +
                 (int)yuvconstants->kYBiasToRgb[0]) >> 6;
    iVar4 = 0;
    if (0 < iVar1) {
      iVar4 = iVar1;
    }
    uVar3 = (uint8_t)iVar4;
    if (0xfe < iVar4) {
      uVar3 = 0xff;
    }
    *rgb_buf = uVar3;
    rgb_buf[1] = uVar3;
    rgb_buf[2] = uVar3;
    rgb_buf[3] = 0xff;
  }
  return;
}

Assistant:

void I400ToARGBRow_C(const uint8_t* src_y,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YPixel(src_y[0], rgb_buf + 0, rgb_buf + 1, rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    YPixel(src_y[1], rgb_buf + 4, rgb_buf + 5, rgb_buf + 6, yuvconstants);
    rgb_buf[7] = 255;
    src_y += 2;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YPixel(src_y[0], rgb_buf + 0, rgb_buf + 1, rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
  }
}